

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void test_quicint(void)

{
  ulong uVar1;
  uint8_t *puVar2;
  int iVar3;
  uint64_t uVar4;
  sbyte sVar5;
  byte bVar6;
  uint8_t **ppuVar7;
  long lVar8;
  uint8_t *p;
  uint8_t local_40;
  uint8_t local_3f [7];
  uint8_t pat [1];
  uint8_t uStack_37;
  uint8_t auStack_36 [2];
  uint8_t auStack_34 [4];
  
  _pat = (uint8_t **)((ulong)_pat & 0xffffffffffffff00);
  p = pat;
  uVar4 = ptls_decode_quicint(&p,&uStack_37);
  _ok((uint)(uVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5be)
  ;
  _ok((uint)(p == &uStack_37),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5be)
  ;
  _pat = (uint8_t **)CONCAT62(_auStack_36,0x40);
  p = pat;
  uVar4 = ptls_decode_quicint(&p,auStack_36);
  _ok((uint)(uVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5bf)
  ;
  _ok((uint)(p == auStack_36),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5bf)
  ;
  _pat = (uint8_t **)CONCAT44(auStack_34,0x80);
  p = pat;
  uVar4 = ptls_decode_quicint(&p,auStack_34);
  _ok((uint)(uVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c0)
  ;
  _ok((uint)(p == auStack_34),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c0)
  ;
  p = (uint8_t *)0xc0;
  _pat = &p;
  uVar4 = ptls_decode_quicint((uint8_t **)pat,&local_40);
  _ok((uint)(uVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c1)
  ;
  _ok((uint)(_pat == (uint8_t **)&local_40),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c1)
  ;
  _pat = (uint8_t **)CONCAT71(_uStack_37,9);
  p = pat;
  uVar4 = ptls_decode_quicint(&p,&uStack_37);
  _ok((uint)(uVar4 == 9),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c2)
  ;
  _ok((uint)(p == &uStack_37),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c2)
  ;
  _pat = (uint8_t **)CONCAT62(_auStack_36,0x940);
  p = pat;
  uVar4 = ptls_decode_quicint(&p,auStack_36);
  _ok((uint)(uVar4 == 9),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c3)
  ;
  _ok((uint)(p == auStack_36),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c3)
  ;
  _pat = (uint8_t **)CONCAT44(auStack_34,0x9000080);
  p = pat;
  uVar4 = ptls_decode_quicint(&p,auStack_34);
  _ok((uint)(uVar4 == 9),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c4)
  ;
  _ok((uint)(p == auStack_34),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c4)
  ;
  p = (uint8_t *)0x9000000000000c0;
  _pat = &p;
  uVar4 = ptls_decode_quicint((uint8_t **)pat,&local_40);
  _ok((uint)(uVar4 == 9),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c5)
  ;
  _ok((uint)(_pat == (uint8_t **)&local_40),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c5)
  ;
  _pat = (uint8_t **)CONCAT62(_auStack_36,0x3452);
  p = pat;
  uVar4 = ptls_decode_quicint(&p,auStack_36);
  _ok((uint)(uVar4 == 0x1234),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c6)
  ;
  _ok((uint)(p == auStack_36),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c6)
  ;
  _pat = (uint8_t **)CONCAT44(auStack_34,0x34120080);
  p = pat;
  uVar4 = ptls_decode_quicint(&p,auStack_34);
  _ok((uint)(uVar4 == 0x1234),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c7)
  ;
  _ok((uint)(p == auStack_34),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c7)
  ;
  p = (uint8_t *)0x34120000000000c0;
  _pat = &p;
  uVar4 = ptls_decode_quicint((uint8_t **)pat,&local_40);
  _ok((uint)(uVar4 == 0x1234),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c8)
  ;
  _ok((uint)(_pat == (uint8_t **)&local_40),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c8)
  ;
  _pat = (uint8_t **)CONCAT44(auStack_34,0x78563492);
  p = pat;
  uVar4 = ptls_decode_quicint(&p,auStack_34);
  _ok((uint)(uVar4 == 0x12345678),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c9)
  ;
  _ok((uint)(p == auStack_34),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c9)
  ;
  p = (uint8_t *)0x78563412000000c0;
  _pat = &p;
  uVar4 = ptls_decode_quicint((uint8_t **)pat,&local_40);
  _ok((uint)(uVar4 == 0x12345678),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5ca)
  ;
  _ok((uint)(_pat == (uint8_t **)&local_40),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5ca)
  ;
  p = (uint8_t *)0xefcdab89674523c1;
  _pat = &p;
  uVar4 = ptls_decode_quicint((uint8_t **)pat,&local_40);
  _ok((uint)(uVar4 == 0x123456789abcdef),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5cb)
  ;
  _ok((uint)(_pat == (uint8_t **)&local_40),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5cb)
  ;
  lVar8 = 0;
  while( true ) {
    p = (uint8_t *)0x7b7b7b7b7b7b7b7b;
    local_40 = '{';
    uVar1 = test_quicint::inputs[lVar8];
    ppuVar7 = &p;
    if (lVar8 - 3U < 6) {
      if (lVar8 - 5U < 4) {
        bVar6 = 0x80;
        sVar5 = 0x18;
        iVar3 = 0x10;
        if (lVar8 == 7) {
          bVar6 = 0xc0;
          sVar5 = 0x38;
          iVar3 = 0x30;
        }
        p = (uint8_t *)CONCAT71(0x7b7b7b7b7b7b7b,(byte)(uVar1 >> sVar5) | bVar6);
        ppuVar7 = (uint8_t **)((long)&p + 1);
        do {
          *(char *)ppuVar7 = (char)(uVar1 >> ((byte)iVar3 & 0x3f));
          ppuVar7 = (uint8_t **)((long)ppuVar7 + 1);
          iVar3 = iVar3 + -8;
        } while (iVar3 != 0);
      }
      else {
        p = (uint8_t *)(CONCAT71(0x7b7b7b7b7b7b7b,(char)(uVar1 >> 8)) | 0x40);
        ppuVar7 = (uint8_t **)((long)&p + 1);
      }
    }
    *(char *)ppuVar7 = (char)uVar1;
    if (8 < (long)((long)ppuVar7 + (1 - (long)&p))) break;
    _pat = &p;
    uVar4 = ptls_decode_quicint((uint8_t **)pat,local_3f);
    _ok((uint)(uVar1 == uVar4),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x5d8);
    puVar2 = (uint8_t *)_pat;
    _ok((uint)(_pat == (uint8_t **)((long)ppuVar7 + 1)),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x5d9);
    _ok((uint)(*puVar2 == '{'),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x5da);
    lVar8 = lVar8 + 1;
    if (lVar8 == 8) {
      return;
    }
  }
  __assert_fail("enc_end - buf <= PTLS_ENCODE_QUICINT_CAPACITY",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                ,0x5d5,"void test_quicint(void)");
}

Assistant:

static void test_quicint(void)
{
#define CHECK_PATTERN(output, ...)                                                                                                 \
    do {                                                                                                                           \
        const uint8_t pat[] = {__VA_ARGS__}, *p = pat;                                                                             \
        ok(output == ptls_decode_quicint(&p, pat + sizeof(pat)));                                                                  \
        ok(p == pat + sizeof(pat));                                                                                                \
    } while (0)
    CHECK_PATTERN(0, 0);
    CHECK_PATTERN(0, 0x40, 0);
    CHECK_PATTERN(0, 0x80, 0, 0, 0);
    CHECK_PATTERN(0, 0xc0, 0, 0, 0, 0, 0, 0, 0);
    CHECK_PATTERN(9, 9);
    CHECK_PATTERN(9, 0x40, 9);
    CHECK_PATTERN(9, 0x80, 0, 0, 9);
    CHECK_PATTERN(9, 0xc0, 0, 0, 0, 0, 0, 0, 9);
    CHECK_PATTERN(0x1234, 0x52, 0x34);
    CHECK_PATTERN(0x1234, 0x80, 0, 0x12, 0x34);
    CHECK_PATTERN(0x1234, 0xc0, 0, 0, 0, 0, 0, 0x12, 0x34);
    CHECK_PATTERN(0x12345678, 0x92, 0x34, 0x56, 0x78);
    CHECK_PATTERN(0x12345678, 0xc0, 0, 0, 0, 0x12, 0x34, 0x56, 0x78);
    CHECK_PATTERN(0x123456789abcdef, 0xc1, 0x23, 0x45, 0x67, 0x89, 0xab, 0xcd, 0xef);
#undef CHECK_PATTERN

    static uint64_t inputs[] = {0, 1, 63, 64, 16383, 16384, 1073741823, 1073741824, UINT64_MAX};
    size_t i;

    for (i = 0; inputs[i] != UINT64_MAX; ++i) {
        uint8_t buf[PTLS_ENCODE_QUICINT_CAPACITY + 1];
        memset(buf, 123, sizeof(buf));
        uint8_t *enc_end = ptls_encode_quicint(buf, inputs[i]);
        assert(enc_end - buf <= PTLS_ENCODE_QUICINT_CAPACITY);
        const uint8_t *src = buf;
        uint64_t decoded = ptls_decode_quicint(&src, buf + sizeof(buf));
        ok(inputs[i] == decoded);
        ok(src == enc_end);
        ok(*src == 123);
    }
}